

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::DockContextBuildNodesFromSettings
               (ImGuiContext *ctx,ImGuiDockNodeSettings *node_settings_array,int node_settings_count
               )

{
  ImVec2 IVar1;
  int *piVar2;
  ImGuiDockNode *node_00;
  ImGuiWindow *pIVar3;
  int in_EDX;
  long in_RSI;
  ImGuiDockNode *root_node;
  char host_window_title [20];
  ImGuiDockNode *node;
  ImGuiDockNodeSettings *settings;
  int node_n;
  ImGuiDockNode *in_stack_ffffffffffffff98;
  ImGuiID id;
  ImGuiContext *in_stack_ffffffffffffffa0;
  ImVec2 local_40;
  float local_38;
  float in_stack_ffffffffffffffcc;
  ImVec2 in_stack_ffffffffffffffd0;
  int local_18;
  
  for (local_18 = 0; id = (ImGuiID)((ulong)in_stack_ffffffffffffff98 >> 0x20), local_18 < in_EDX;
      local_18 = local_18 + 1) {
    piVar2 = (int *)(in_RSI + (long)local_18 * 0x24);
    if (*piVar2 != 0) {
      node_00 = DockContextAddNode((ImGuiContext *)in_stack_ffffffffffffffd0,
                                   (ImGuiID)in_stack_ffffffffffffffcc);
      if (piVar2[1] == 0) {
        in_stack_ffffffffffffff98 = (ImGuiDockNode *)0x0;
      }
      else {
        in_stack_ffffffffffffff98 = DockContextFindNodeByID(in_stack_ffffffffffffffa0,id);
      }
      node_00->ParentNode = in_stack_ffffffffffffff98;
      ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffffd0,(float)(int)(short)piVar2[6],
                     (float)(int)*(short *)((long)piVar2 + 0x1a));
      node_00->Pos = in_stack_ffffffffffffffd0;
      ImVec2::ImVec2((ImVec2 *)&local_38,(float)(int)(short)piVar2[7],
                     (float)(int)*(short *)((long)piVar2 + 0x1e));
      IVar1.y = in_stack_ffffffffffffffcc;
      IVar1.x = local_38;
      node_00->Size = IVar1;
      ImVec2::ImVec2(&local_40,(float)(int)(short)piVar2[8],
                     (float)(int)*(short *)((long)piVar2 + 0x22));
      node_00->SizeRef = local_40;
      *(ushort *)&node_00->field_0xb0 = *(ushort *)&node_00->field_0xb0 & 0xfe3f | 0x40;
      *(ushort *)&node_00->field_0xb0 = *(ushort *)&node_00->field_0xb0 & 0xffc7 | 8;
      *(ushort *)&node_00->field_0xb0 = *(ushort *)&node_00->field_0xb0 & 0xfff8 | 1;
      if ((node_00->ParentNode == (ImGuiDockNode *)0x0) ||
         (node_00->ParentNode->ChildNodes[0] != (ImGuiDockNode *)0x0)) {
        if ((node_00->ParentNode != (ImGuiDockNode *)0x0) &&
           (node_00->ParentNode->ChildNodes[1] == (ImGuiDockNode *)0x0)) {
          node_00->ParentNode->ChildNodes[1] = node_00;
        }
      }
      else {
        node_00->ParentNode->ChildNodes[0] = node_00;
      }
      node_00->SelectedTabID = piVar2[3];
      node_00->SplitAxis = (int)(char)piVar2[4];
      node_00->LocalFlags = piVar2[5] & 0x1fc20U | node_00->LocalFlags;
      in_stack_ffffffffffffffa0 = (ImGuiContext *)DockNodeGetRootNode(node_00);
      DockNodeGetHostWindowTitle
                ((ImGuiDockNode *)in_stack_ffffffffffffffa0,(char *)in_stack_ffffffffffffff98,0);
      pIVar3 = FindWindowByName(&in_stack_ffffffffffffffa0->Initialized);
      node_00->HostWindow = pIVar3;
    }
  }
  return;
}

Assistant:

static void ImGui::DockContextBuildNodesFromSettings(ImGuiContext* ctx, ImGuiDockNodeSettings* node_settings_array, int node_settings_count)
{
    // Build nodes
    for (int node_n = 0; node_n < node_settings_count; node_n++)
    {
        ImGuiDockNodeSettings* settings = &node_settings_array[node_n];
        if (settings->ID == 0)
            continue;
        ImGuiDockNode* node = DockContextAddNode(ctx, settings->ID);
        node->ParentNode = settings->ParentNodeID ? DockContextFindNodeByID(ctx, settings->ParentNodeID) : NULL;
        node->Pos = ImVec2(settings->Pos.x, settings->Pos.y);
        node->Size = ImVec2(settings->Size.x, settings->Size.y);
        node->SizeRef = ImVec2(settings->SizeRef.x, settings->SizeRef.y);
        node->AuthorityForPos = node->AuthorityForSize = node->AuthorityForViewport = ImGuiDataAuthority_DockNode;
        if (node->ParentNode && node->ParentNode->ChildNodes[0] == NULL)
            node->ParentNode->ChildNodes[0] = node;
        else if (node->ParentNode && node->ParentNode->ChildNodes[1] == NULL)
            node->ParentNode->ChildNodes[1] = node;
        node->SelectedTabID = settings->SelectedWindowID;
        node->SplitAxis = settings->SplitAxis;
        node->LocalFlags |= (settings->Flags & ImGuiDockNodeFlags_SavedFlagsMask_);

        // Bind host window immediately if it already exist (in case of a rebuild)
        // This is useful as the RootWindowForTitleBarHighlight links necessary to highlight the currently focused node requires node->HostWindow to be set.
        char host_window_title[20];
        ImGuiDockNode* root_node = DockNodeGetRootNode(node);
        node->HostWindow = FindWindowByName(DockNodeGetHostWindowTitle(root_node, host_window_title, IM_ARRAYSIZE(host_window_title)));
    }
}